

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::VecAttributesImpl::getIndex
          (VecAttributesImpl *this,XMLCh *uri,XMLCh *localPart,XMLSize_t *index)

{
  XMLCh XVar1;
  XMLCh XVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLAttr *pXVar4;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  XMLSize_t getAt;
  bool bVar7;
  bool bVar8;
  XMLBuffer uriBuffer;
  XMLBuffer local_68;
  
  local_68.fMemoryManager =
       (this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).fMemoryManager;
  local_68.fIndex = 0;
  local_68.fCapacity = 0x3ff;
  local_68.fFullSize = 0;
  local_68.fUsed = false;
  local_68.fFullHandler = (XMLBufferFullHandler *)0x0;
  local_68.fBuffer = (XMLCh *)0x0;
  iVar3 = (*(local_68.fMemoryManager)->_vptr_MemoryManager[3])();
  local_68.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar3);
  *local_68.fBuffer = L'\0';
  *index = 0;
  bVar7 = this->fCount != 0;
  if (bVar7) {
    getAt = 0;
    do {
      pXVar4 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                         (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      XMLScanner::getURIText(this->fScanner,pXVar4->fAttName->fURIId,&local_68);
      pXVar5 = pXVar4->fAttName->fLocalPart;
      if (pXVar5 == localPart) {
LAB_002bf004:
        local_68.fBuffer[local_68.fIndex] = L'\0';
        if (local_68.fBuffer == uri) break;
        pXVar5 = local_68.fBuffer;
        pXVar6 = uri;
        if (local_68.fBuffer == (XMLCh *)0x0 || uri == (XMLCh *)0x0) {
          if (local_68.fBuffer == (XMLCh *)0x0) {
            if (uri == (XMLCh *)0x0) break;
LAB_002bf06b:
            bVar8 = *pXVar6 == L'\0';
          }
          else {
            bVar8 = *local_68.fBuffer == L'\0';
            if (bVar8 && uri != (XMLCh *)0x0) goto LAB_002bf06b;
          }
          if (bVar8) break;
        }
        else {
          do {
            XVar1 = *pXVar5;
            if (XVar1 == L'\0') goto LAB_002bf06b;
            XVar2 = *pXVar6;
            pXVar5 = pXVar5 + 1;
            pXVar6 = pXVar6 + 1;
          } while (XVar1 == XVar2);
        }
      }
      else {
        pXVar6 = localPart;
        if ((localPart == (XMLCh *)0x0) || (pXVar5 == (XMLCh *)0x0)) {
          if (pXVar5 == (XMLCh *)0x0) {
            if (localPart == (XMLCh *)0x0) goto LAB_002bf004;
LAB_002beff9:
            bVar8 = *pXVar6 == L'\0';
          }
          else {
            bVar8 = *pXVar5 == L'\0';
            if ((localPart != (XMLCh *)0x0) && (*pXVar5 == L'\0')) goto LAB_002beff9;
          }
          if (bVar8) goto LAB_002bf004;
        }
        else {
          do {
            XVar1 = *pXVar5;
            if (XVar1 == L'\0') goto LAB_002beff9;
            pXVar5 = pXVar5 + 1;
            XVar2 = *pXVar6;
            pXVar6 = pXVar6 + 1;
          } while (XVar1 == XVar2);
        }
      }
      getAt = *index + 1;
      *index = getAt;
      bVar7 = getAt < this->fCount;
    } while (bVar7);
  }
  (*(local_68.fMemoryManager)->_vptr_MemoryManager[4])(local_68.fMemoryManager,local_68.fBuffer);
  return bVar7;
}

Assistant:

bool VecAttributesImpl::getIndex(const XMLCh* const uri,
                                 const XMLCh* const localPart,
                                 XMLSize_t& index) const
{
  //
  //  Search the vector for the attribute with the given name and return
  //  its type.
  //
  XMLBuffer uriBuffer(1023, fVector->getMemoryManager()) ;
  for (index = 0; index < fCount; index++)
  {
    const XMLAttr* curElem = fVector->elementAt(index);

    fScanner->getURIText(curElem->getURIId(), uriBuffer) ;

    if ( (XMLString::equals(curElem->getName(), localPart)) &&
         (XMLString::equals(uriBuffer.getRawBuffer(), uri)) )
      return true;
  }
  return false;
}